

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_filename.c
# Opt level: O2

void test_read_format_lha_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive *paVar4;
  int64_t iVar5;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_lha_filename_cp932.lzh");
  pcVar3 = setlocale(6,"ja_JP.eucJP");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'(');
    pcVar3 = "ja_JP.eucJP locale not available on this system.";
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                     ,L'2',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP932");
    iVar1 = archive_read_free(paVar4);
    if (wVar2 == L'\0') {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                       ,L'<',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_lha_filename_cp932.lzh",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'@',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'E',anon_var_dwarf_53104 + 7,"\"\\xB4\\xC1\\xBB\\xFA\\x2E\\x74\\x78\\x74\"",
                 pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'F',8,"8",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'G',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'H',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'L',anon_var_dwarf_531be + 0xb,"\"\\xC9\\xBD\\x2E\\x74\\x78\\x74\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'M',4,"4",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'N',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'O',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'R',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'U',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'V',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",paVar4)
      ;
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      goto LAB_0016d6ea;
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'6');
    pcVar3 = "This system cannot convert character-set from CP932 to eucJP.";
  }
  test_skipping(pcVar3);
LAB_0016d6ea:
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'g');
    pcVar3 = "en_US.UTF-8 locale not available on this system.";
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                     ,L'p',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP932");
    iVar1 = archive_read_free(paVar4);
    if (wVar2 == L'\0') {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                       ,L'z',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_lha_filename_cp932.lzh",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'~',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'\x83',anon_var_dwarf_72f2a + 0x36,
                 "\"\\xE6\\xBC\\xA2\\xE5\\xAD\\x97\\x2E\\x74\\x78\\x74\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x84',8,"8",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'\x89',anon_var_dwarf_532aa + 0x10,"\"\\xE8\\xA1\\xA8\\x2E\\x74\\x78\\x74\"",
                 pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x8a',4,"4",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x8e',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x91',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x92',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",
                          paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L't');
    pcVar3 = "This system cannot convert character-set from CP932 to UTF-8.";
  }
  test_skipping(pcVar3);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha_filename)
{
	/* A sample file was created with LHA32.EXE through UNLHA.DLL. */
	const char *refname = "test_read_format_lha_filename_cp932.lzh";

	extract_reference_file(refname);

	test_read_format_lha_filename_CP932_eucJP(refname);
	test_read_format_lha_filename_CP932_UTF8(refname);
	test_read_format_lha_filename_CP932_Windows(refname);
}